

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

MOJOSHADER_astStatement *
new_for_statement(Context_conflict *ctx,MOJOSHADER_astVariableDeclaration *decl,
                 MOJOSHADER_astExpression *initializer,MOJOSHADER_astExpression *looptest,
                 MOJOSHADER_astExpression *counter,MOJOSHADER_astStatement *statement)

{
  MOJOSHADER_astForStatement *retval;
  MOJOSHADER_astStatement *statement_local;
  MOJOSHADER_astExpression *counter_local;
  MOJOSHADER_astExpression *looptest_local;
  MOJOSHADER_astExpression *initializer_local;
  MOJOSHADER_astVariableDeclaration *decl_local;
  Context_conflict *ctx_local;
  
  ctx_local = (Context_conflict *)Malloc(ctx,0x50);
  if (ctx_local == (Context_conflict *)0x0) {
    ctx_local = (Context_conflict *)0x0;
  }
  else {
    ctx_local->isfail = 0x4b;
    ctx_local->malloc = (MOJOSHADER_malloc)ctx->sourcefile;
    *(uint *)&ctx_local->free = ctx->sourceline;
    ctx_local->malloc_data = (void *)0x0;
    *(undefined4 *)&ctx_local->errors = 0xffffffff;
    ctx_local->warnings = (ErrorList *)decl;
    ctx_local->strcache = (StringCache *)initializer;
    ctx_local->sourcefile = (char *)looptest;
    *(MOJOSHADER_astExpression **)&ctx_local->sourceline = counter;
    (ctx_local->usertypes).hash = (HashTable *)statement;
  }
  return (MOJOSHADER_astStatement *)ctx_local;
}

Assistant:

static MOJOSHADER_astStatement *new_for_statement(Context *ctx,
                                    MOJOSHADER_astVariableDeclaration *decl,
                                    MOJOSHADER_astExpression *initializer,
                                    MOJOSHADER_astExpression *looptest,
                                    MOJOSHADER_astExpression *counter,
                                    MOJOSHADER_astStatement *statement)
{
    NEW_AST_NODE(retval, MOJOSHADER_astForStatement,
                 MOJOSHADER_AST_STATEMENT_FOR);
    retval->next = NULL;
    retval->unroll = -1;
    retval->var_decl = decl;
    retval->initializer = initializer;
    retval->looptest = looptest;
    retval->counter = counter;
    retval->statement = statement;
    return (MOJOSHADER_astStatement *) retval;
}